

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

int lj_cf_ffi_typeinfo(lua_State *L)

{
  uint uVar1;
  long *lenx;
  int *piVar2;
  lua_State *plVar3;
  TValue *pTVar4;
  ulong uVar5;
  lua_State *in_RDI;
  GCstr *s;
  GCtab *t;
  CType *ct;
  CTypeID id;
  CTState *cts;
  CTState *cts_1;
  lua_State *in_stack_fffffffffffffec8;
  lua_State *key;
  lua_State *in_stack_fffffffffffffed0;
  lua_State *in_stack_fffffffffffffed8;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int iVar6;
  
  lenx = (long *)(ulong)*(uint *)((ulong)(in_RDI->glref).ptr32 + 0x194);
  lenx[2] = (long)in_RDI;
  uVar1 = ffi_checkint(in_stack_fffffffffffffed0,(int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
  if ((uVar1 == 0) || (*(uint *)(lenx + 1) <= uVar1)) {
    iVar6 = 0;
  }
  else {
    piVar2 = (int *)(*lenx + (ulong)uVar1 * 0x10);
    lua_createtable(in_stack_fffffffffffffed8,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                    (int)in_stack_fffffffffffffed0);
    plVar3 = (lua_State *)(ulong)in_RDI->top[-1].u32.lo;
    lj_str_new((lua_State *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (char *)in_RDI,(size_t)lenx);
    pTVar4 = lj_tab_setstr(in_stack_fffffffffffffed8,(GCtab *)in_stack_fffffffffffffed0,
                           (GCstr *)in_stack_fffffffffffffec8);
    pTVar4->n = (double)*piVar2;
    if (piVar2[1] != -1) {
      lj_str_new((lua_State *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 (char *)in_RDI,(size_t)lenx);
      pTVar4 = lj_tab_setstr(in_stack_fffffffffffffed8,(GCtab *)in_stack_fffffffffffffed0,
                             (GCstr *)in_stack_fffffffffffffec8);
      pTVar4->n = (double)piVar2[1];
    }
    key = in_RDI;
    if ((short)piVar2[2] != 0) {
      lj_str_new((lua_State *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 (char *)in_RDI,(size_t)lenx);
      pTVar4 = lj_tab_setstr(plVar3,(GCtab *)in_RDI,(GCstr *)in_stack_fffffffffffffec8);
      pTVar4->n = (double)*(ushort *)(piVar2 + 2);
      in_stack_fffffffffffffed0 = in_RDI;
      in_stack_fffffffffffffed8 = plVar3;
    }
    plVar3 = key;
    if (piVar2[3] != 0) {
      uVar1 = piVar2[3];
      uVar5 = (ulong)uVar1;
      if ((*(byte *)(uVar5 + 4) & (*(byte *)((ulong)(key->glref).ptr32 + 0x58) ^ 3) & 3) != 0) {
        *(byte *)(uVar5 + 4) = *(byte *)(uVar5 + 4) ^ 3;
      }
      lj_str_new((lua_State *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                 (char *)key,(size_t)lenx);
      pTVar4 = lj_tab_setstr(in_stack_fffffffffffffed8,(GCtab *)in_stack_fffffffffffffed0,
                             (GCstr *)key);
      (pTVar4->u32).lo = uVar1;
      (pTVar4->field_2).it = 0xfffffffb;
      in_stack_fffffffffffffec8 = key;
    }
    if (*(uint *)((ulong)(plVar3->glref).ptr32 + 0x54) <=
        *(uint *)((ulong)(plVar3->glref).ptr32 + 0x50)) {
      lj_gc_step(in_stack_fffffffffffffec8);
    }
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

LJLIB_CF(ffi_typeinfo)
{
  CTState *cts = ctype_cts(L);
  CTypeID id = (CTypeID)ffi_checkint(L, 1);
  if (id > 0 && id < cts->top) {
    CType *ct = ctype_get(cts, id);
    GCtab *t;
    lua_createtable(L, 0, 4);  /* Increment hash size if fields are added. */
    t = tabV(L->top-1);
    setintV(lj_tab_setstr(L, t, lj_str_newlit(L, "info")), (int32_t)ct->info);
    if (ct->size != CTSIZE_INVALID)
      setintV(lj_tab_setstr(L, t, lj_str_newlit(L, "size")), (int32_t)ct->size);
    if (ct->sib)
      setintV(lj_tab_setstr(L, t, lj_str_newlit(L, "sib")), (int32_t)ct->sib);
    if (gcref(ct->name)) {
      GCstr *s = gco2str(gcref(ct->name));
      if (isdead(G(L), obj2gco(s))) flipwhite(obj2gco(s));
      setstrV(L, lj_tab_setstr(L, t, lj_str_newlit(L, "name")), s);
    }
    lj_gc_check(L);
    return 1;
  }
  return 0;
}